

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

int ON_SubDComponentAndNumber::CompareNumber
              (ON_SubDComponentAndNumber *a,ON_SubDComponentAndNumber *b)

{
  int iVar1;
  
  if (a == b) {
    return 0;
  }
  if (a != (ON_SubDComponentAndNumber *)0x0) {
    if (b != (ON_SubDComponentAndNumber *)0x0) {
      iVar1 = ON_CompareDouble(a->m_x,b->m_x);
      return iVar1;
    }
    return 1;
  }
  return -1;
}

Assistant:

int ON_SubDComponentAndNumber::CompareNumber(
  const ON_SubDComponentAndNumber* a,
  const ON_SubDComponentAndNumber* b
)
{
  if (a == b)
    return 0;
  if (nullptr == a)
    return -1;
  if (nullptr == b)
    return 1;
  return ON_CompareDouble(a->m_x, b->m_x);
}